

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeBase *pTVar1;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar2;
  TypeFunction *pTVar3;
  undefined4 extraout_var;
  TypeBase **ppTVar4;
  uint uVar5;
  ulong uVar6;
  uint hash;
  ulong uVar7;
  long lVar8;
  ArrayView<ArgumentData> arguments_01;
  IntrusiveList<TypeHandle> argumentTypes;
  IntrusiveList<TypeHandle> local_48;
  SynBase *local_38;
  TypeHandle *node;
  
  uVar7 = arguments._8_8_;
  arguments_01.data = arguments.data;
  if (returnType != (TypeBase *)0x0) {
    if (returnType->typeID == 0x1b) {
LAB_001e033b:
      __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x773,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
    if (returnType != (TypeBase *)0x0) {
      if (returnType->typeID == 0x1c) goto LAB_001e033b;
      if (returnType != (TypeBase *)0x0) {
        if (returnType->typeID == 0x1a) goto LAB_001e033b;
        if ((returnType != (TypeBase *)0x0) && (returnType->typeID == 0)) {
          __assert_fail("!isType<TypeError>(returnType)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x774,
                        "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                       );
        }
      }
    }
  }
  hash = returnType->nameHash;
  if (arguments.count != 0) {
    ppTVar4 = &(arguments_01.data)->type;
    uVar6 = uVar7 & 0xffffffff;
    do {
      pTVar1 = *ppTVar4;
      if (pTVar1 != (TypeBase *)0x0) {
        if (pTVar1->typeID == 0x1b) {
LAB_001e02de:
          __assert_fail("!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x77e,
                        "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                       );
        }
        if (pTVar1 != (TypeBase *)0x0) {
          if (pTVar1->typeID == 0x1c) goto LAB_001e02de;
          if (pTVar1 != (TypeBase *)0x0) {
            if (pTVar1->typeID == 0x1a) goto LAB_001e02de;
            if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0)) {
              __assert_fail("!isType<TypeError>(curr)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x77f,
                            "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                           );
            }
          }
        }
      }
      if (pTVar1 == this->typeAuto) {
        __assert_fail("curr != typeAuto",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x782,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                     );
      }
      hash = hash * 3 + pTVar1->nameHash;
      ppTVar4 = ppTVar4 + 6;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  arguments_01._8_8_ = uVar7 & 0xffffffff;
  local_38 = source;
  pTVar3 = GetFunctionTypeFromCache(&this->functionTypeMap,hash,returnType,arguments_01);
  if (pTVar3 == (TypeFunction *)0x0) {
    local_48.head = (TypeHandle *)0x0;
    local_48.tail = (TypeHandle *)0x0;
    if (arguments.count != 0) {
      lVar8 = 0;
      do {
        iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
        node = (TypeHandle *)CONCAT44(extraout_var,iVar2);
        node->type = *(TypeBase **)((long)&(arguments_01.data)->type + lVar8);
        node->next = (TypeHandle *)0x0;
        node->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_48,node);
        lVar8 = lVar8 + 0x30;
      } while ((uVar7 & 0xffffffff) * 0x30 != lVar8);
    }
    arguments_00.tail = local_48.tail;
    arguments_00.head = local_48.head;
    pTVar3 = GetFunctionType(this,local_38,returnType,arguments_00);
  }
  return pTVar3;
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		TypeBase *curr = arguments[i].type;

		(void)curr;

		assert(!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr));
		assert(!isType<TypeError>(curr));

		// Can't have auto as argument
		assert(curr != typeAuto);

		hash = (hash << 1) + hash + curr->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	IntrusiveList<TypeHandle> argumentTypes;

	for(unsigned i = 0; i < arguments.size(); i++)
		argumentTypes.push_back(new (get<TypeHandle>()) TypeHandle(arguments[i].type));

	return GetFunctionType(source, returnType, argumentTypes);
}